

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O2

int ON_Font::CompareFontCharacteristicsForExperts
              (bool bComparePlatformSpecificCharacteristics,bool bIgnoreUnsetCharacteristics,
              ON_Font *lhs,ON_Font *rhs)

{
  bool bVar1;
  Weight font_weight;
  Style SVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  wchar_t *pwVar6;
  wchar_t *pwVar7;
  Style SVar8;
  Weight font_weight_00;
  double dVar9;
  double dVar10;
  ON_wString rhs_logfont_name;
  ON_wString lhs_logfont_name;
  ON_wString rhs_family_name;
  ON_wString lhs_family_name;
  
  FamilyName((ON_Font *)&lhs_family_name);
  FamilyName((ON_Font *)&rhs_family_name);
  if ((!bIgnoreUnsetCharacteristics) ||
     ((bVar1 = ON_wString::IsNotEmpty(&lhs_family_name), bVar1 &&
      (bVar1 = ON_wString::IsNotEmpty(&rhs_family_name), bVar1)))) {
    pwVar6 = ON_wString::operator_cast_to_wchar_t_(&lhs_family_name);
    pwVar7 = ON_wString::operator_cast_to_wchar_t_(&rhs_family_name);
    uVar3 = ON_wString::CompareOrdinal(pwVar6,pwVar7,true);
    if (uVar3 != 0) {
      uVar4 = 0;
      goto LAB_004a78a9;
    }
  }
  WindowsLogfontName((ON_Font *)&lhs_logfont_name);
  WindowsLogfontName((ON_Font *)&rhs_logfont_name);
  if ((!bIgnoreUnsetCharacteristics) ||
     ((bVar1 = ON_wString::IsNotEmpty(&lhs_logfont_name), bVar1 &&
      (bVar1 = ON_wString::IsNotEmpty(&rhs_logfont_name), bVar1)))) {
    pwVar6 = ON_wString::operator_cast_to_wchar_t_(&lhs_logfont_name);
    pwVar7 = ON_wString::operator_cast_to_wchar_t_(&rhs_logfont_name);
    uVar3 = ON_wString::CompareOrdinal(pwVar6,pwVar7,true);
    if (uVar3 == 0) {
      font_weight = lhs->m_font_weight;
      font_weight_00 = rhs->m_font_weight;
      if (bIgnoreUnsetCharacteristics) goto LAB_004a7821;
      goto LAB_004a7830;
    }
    uVar4 = 0;
  }
  else {
    font_weight = lhs->m_font_weight;
    font_weight_00 = rhs->m_font_weight;
LAB_004a7821:
    if (font_weight == Unset || font_weight_00 == Unset) {
      SVar8 = lhs->m_font_style;
      SVar2 = rhs->m_font_style;
LAB_004a7869:
      if (((SVar8 == Unset) || (SVar2 == Unset)) || (SVar8 == SVar2)) {
        SVar8 = lhs->m_font_stretch;
        if ((SVar8 != Unset) && (SVar2 = rhs->m_font_stretch, SVar2 != Unset)) {
LAB_004a7884:
          if (SVar8 != SVar2) goto LAB_004a7888;
        }
        SVar2 = rhs->m_font_bUnderlined;
        uVar3 = (uint)lhs->m_font_bUnderlined;
        if (lhs->m_font_bUnderlined == (bool)SVar2) {
          SVar2 = rhs->m_font_bStrikethrough;
          uVar3 = (uint)lhs->m_font_bStrikethrough;
          if (lhs->m_font_bStrikethrough == (bool)SVar2) {
            dVar10 = lhs->m_point_size;
            dVar9 = (double)(-(ulong)(dVar10 < 10000000000.0) & (ulong)dVar10 &
                            -(ulong)(0.0 < dVar10));
            dVar10 = rhs->m_point_size;
            dVar10 = (double)(-(ulong)(dVar10 < 10000000000.0) & (ulong)dVar10 &
                             -(ulong)(0.0 < dVar10));
            if (dVar10 <= dVar9) {
              uVar3 = (uint)(dVar10 < dVar9);
              SVar2 = Unset;
            }
            else {
              SVar2 = Unset;
              uVar3 = 0xffffffff;
            }
          }
        }
      }
      else {
LAB_004a7888:
        uVar3 = (uint)SVar8;
      }
      uVar4 = (uint)SVar2;
    }
    else {
LAB_004a7830:
      uVar3 = WindowsLogfontWeightFromWeight(font_weight);
      uVar4 = WindowsLogfontWeightFromWeight(font_weight_00);
      if (uVar3 == uVar4) {
        SVar8 = lhs->m_font_style;
        SVar2 = rhs->m_font_style;
        if (bIgnoreUnsetCharacteristics) goto LAB_004a7869;
        if (SVar8 == SVar2) {
          SVar8 = lhs->m_font_stretch;
          SVar2 = rhs->m_font_stretch;
          goto LAB_004a7884;
        }
        goto LAB_004a7888;
      }
    }
  }
  ON_wString::~ON_wString(&rhs_logfont_name);
  ON_wString::~ON_wString(&lhs_logfont_name);
LAB_004a78a9:
  ON_wString::~ON_wString(&rhs_family_name);
  ON_wString::~ON_wString(&lhs_family_name);
  uVar5 = (uint)((int)uVar4 < (int)uVar3);
  if ((int)uVar3 < (int)uVar4) {
    uVar5 = 0xffffffff;
  }
  return uVar5;
}

Assistant:

int ON_Font::CompareFontCharacteristicsForExperts(
  bool bComparePlatformSpecificCharacteristics,
  bool bIgnoreUnsetCharacteristics,
  const ON_Font& lhs,
  const ON_Font& rhs
)
{
  int i = 0;
  int j = 0;

  for (;;)
  {
    const ON_wString lhs_family_name = lhs.FamilyName();
    const ON_wString rhs_family_name = rhs.FamilyName();
    const bool bCompareFamilyName =
      false == bIgnoreUnsetCharacteristics
      || (0 != lhs_family_name.IsNotEmpty() && 0 != rhs_family_name.IsNotEmpty());
    if (bCompareFamilyName)
    {
      i = ON_wString::CompareOrdinal(lhs_family_name, rhs_family_name, true);
      j = 0;
      if ( i != j )
        break;
    }

    const ON_wString lhs_logfont_name = lhs.WindowsLogfontName();
    const ON_wString rhs_logfont_name = rhs.WindowsLogfontName();
    const bool bCompareWindowsLogfontName =
      false == bIgnoreUnsetCharacteristics
      || (lhs_logfont_name.IsNotEmpty() && rhs_logfont_name.IsNotEmpty());
    if (bCompareWindowsLogfontName)
    {
      i = ON_wString::CompareOrdinal(lhs_logfont_name, rhs_logfont_name, true);
      j = 0;
      if ( i != j )
        break;
    }

    const ON_Font::Weight lhs_weight = lhs.m_font_weight;
    const ON_Font::Weight rhs_weight = rhs.m_font_weight;
    const bool bCompareWeight =
      false == bIgnoreUnsetCharacteristics
      || (ON_Font::Weight::Unset != lhs_weight && ON_Font::Weight::Unset != rhs_weight);
    if (bCompareWeight)
    {
      i = ON_Font::WindowsLogfontWeightFromWeight(lhs_weight);
      j = ON_Font::WindowsLogfontWeightFromWeight(rhs_weight);
      if (i != j)
        break;
    }

    const ON_Font::Style lhs_style = lhs.m_font_style;
    const ON_Font::Style rhs_style = rhs.m_font_style;
    const bool bCompareStyle =
      false == bIgnoreUnsetCharacteristics
      || (ON_Font::Style::Unset != lhs_style && ON_Font::Style::Unset != rhs_style);
    if (bCompareStyle)
    {
      i = static_cast<int>(lhs_style);
      j = static_cast<int>(rhs_style);
      if (i != j)
        break;
    }

    const ON_Font::Stretch lhs_stretch = lhs.m_font_stretch;
    const ON_Font::Stretch rhs_stretch = rhs.m_font_stretch;
    const bool bCompareStretch =
      false == bIgnoreUnsetCharacteristics
      || (ON_Font::Stretch::Unset != lhs_stretch && ON_Font::Stretch::Unset != rhs_stretch);
    if (bCompareStretch)
    {
      i = static_cast<int>(lhs_stretch);
      j = static_cast<int>(rhs_stretch);
      if (i != j)
        break;
    }

    i = lhs.m_font_bUnderlined ? 1 : 0;
    j = rhs.m_font_bUnderlined ? 1 : 0;
    if ( i != j )
      break;

    i = lhs.m_font_bStrikethrough ? 1 : 0;
    j = rhs.m_font_bStrikethrough ? 1 : 0;
    if ( i != j )
      break;

    const double lhs_point_size = ON_Font::IsValidPointSize(lhs.m_point_size) ? lhs.m_point_size : 0.0;
    const double rhs_point_size = ON_Font::IsValidPointSize(rhs.m_point_size) ? rhs.m_point_size : 0.0;
    j = 0;
    if (lhs_point_size < rhs_point_size)
      i = -1;
    else if (rhs_point_size < lhs_point_size)
      i = 1;
    else
      i = 0;
    if (i != j)
      break;
 
    if (false == bComparePlatformSpecificCharacteristics)
      break;
 
#if defined(ON_RUNTIME_WIN) 
    i = (ON_Font::WindowsConstants::logfont_symbol_charset == lhs.m_logfont_charset) ? 1 : 0;
    j = (ON_Font::WindowsConstants::logfont_symbol_charset == rhs.m_logfont_charset) ? 1 : 0;
    if ( i != j )
      break;
#endif


#if defined(ON_RUNTIME_APPLE)     
  const ON_wString lhs_postscript_name = lhs.PostScriptName();
  const ON_wString rhs_postscript_name = rhs.PostScriptName();
    const bool bComparePostScriptName =
      false == bIgnoreUnsetCharacteristics
      || (lhs_postscript_name.IsNotEmpty() && rhs_postscript_name.IsNotEmpty());
    if (bComparePostScriptName)
    {
      i = ON_wString::CompareOrdinal(lhs_postscript_name, rhs_postscript_name, false);
      if (0 == i)
      {
        if (lhs.m_apple_font_weight_trait < rhs.m_apple_font_weight_trait)
          i = -1;
        else if (lhs.m_apple_font_weight_trait > rhs.m_apple_font_weight_trait)
          i = 1;
      }
      j = 0;
      if (i != j)
        break;
    }
#endif

    break;
  }

  if (i < j)
    return -1;
  if (i > j)
    return 1;

  return 0;
}